

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>
               (bit_array *x,quadratic_cost_type<float> *c,int variables,int value_if_0)

{
  int i;
  int index;
  float fVar1;
  
  for (index = 0; variables != index; index = index + 1) {
    fVar1 = quadratic_cost_type<float>::operator[](c,index);
    if ((0.0 < fVar1) || (value_if_0 != 0 && fVar1 == 0.0)) {
      bit_array_impl::set(&x->super_bit_array_impl,index);
    }
    else {
      bit_array_impl::unset(&x->super_bit_array_impl,index);
    }
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}